

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::legacy_tex_op
          (string *__return_storage_ptr__,CompilerGLSL *this,string *op,SPIRType *imgtype,
          uint32_t tex)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  SPIREntryPoint *pSVar6;
  CompilerError *pCVar7;
  byte bVar8;
  uint *ts_1;
  string *psVar9;
  char *pcVar10;
  uint32_t uVar11;
  undefined4 in_register_00000084;
  char *type;
  string *local_78;
  string type_prefix;
  string local_50;
  
  ts_1 = &switchD_00259460::switchdataD_00375de0;
  type = "2D";
  switch((imgtype->image).dim) {
  case Dim1D:
    if ((this->options).es == true) break;
    ts_1 = (uint *)0x379c6d;
    type = (char *)ts_1;
    if ((imgtype->image).arrayed != false) {
      ts_1 = (uint *)0x379c76;
      type = (char *)ts_1;
    }
    goto LAB_002594e0;
  case Dim2D:
    pcVar10 = "iimage2DArray";
    if (((this->options).es & 1U) != 0) {
      pcVar10 = "iimage2D";
    }
    ts_1 = (uint *)(pcVar10 + 6);
    type = (char *)ts_1;
    if ((imgtype->image).arrayed == false) {
      ts_1 = (uint *)0x379c84;
      type = (char *)ts_1;
    }
    goto LAB_002594e0;
  case Dim3D:
    type = "3D";
    break;
  case DimCube:
    type = "Cube";
    break;
  case DimRect:
    type = "2DRect";
    break;
  case DimBuffer:
    type = "Buffer";
    break;
  case DimSubpassData:
    break;
  default:
    type = "";
    ts_1 = (uint *)imgtype;
  }
LAB_002594e0:
  uVar11 = tex;
  local_78 = __return_storage_ptr__;
  pSVar6 = Compiler::get_entry_point(&this->super_Compiler);
  bVar1 = ::std::operator==(op,"textureGrad");
  if ((bVar1) || (bVar1 = ::std::operator==(op,"textureProjGrad"), bVar1)) {
LAB_0025955a:
    bVar1 = (this->options).es;
    uVar5 = (this->options).version;
    ts_1 = (uint *)(ulong)uVar5;
    if ((uVar5 < 300 & bVar1) == 1) {
      ::std::__cxx11::string::string
                ((string *)&type_prefix,"GL_EXT_shader_texture_lod",(allocator *)&local_50);
      require_extension_internal(this,&type_prefix);
      ::std::__cxx11::string::~string((string *)&type_prefix);
      bVar1 = true;
      goto LAB_002595e5;
    }
    ts_1 = (uint *)(ulong)CONCAT31((int3)(uVar5 >> 8),0x81 < uVar5);
    if (bVar1 == false && 0x81 >= uVar5) {
      ::std::__cxx11::string::string
                ((string *)&type_prefix,"GL_ARB_shader_texture_lod",(allocator *)&local_50);
      require_extension_internal(this,&type_prefix);
      ::std::__cxx11::string::~string((string *)&type_prefix);
    }
  }
  else {
    bVar1 = ::std::operator==(op,"textureLod");
    if (!bVar1) {
      bVar2 = ::std::operator==(op,"textureProjLod");
      bVar1 = false;
      if ((!bVar2) || (bVar1 = false, pSVar6->model == ExecutionModelVertex)) goto LAB_002595e5;
      goto LAB_0025955a;
    }
    if (pSVar6->model != ExecutionModelVertex) goto LAB_0025955a;
  }
  bVar1 = false;
LAB_002595e5:
  bVar2 = ::std::operator==(op,"textureLodOffset");
  if ((bVar2) || (bVar2 = ::std::operator==(op,"textureProjLodOffset"), bVar2)) {
    if (((this->options).es == true) && ((this->options).version < 300)) {
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      join<std::__cxx11::string_const&,char_const(&)[26]>
                (&type_prefix,(spirv_cross *)op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " not allowed in legacy ES",(char (*) [26])ts_1);
      CompilerError::CompilerError(pCVar7,&type_prefix);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::string
              ((string *)&type_prefix,"GL_EXT_gpu_shader4",(allocator *)&local_50);
    require_extension_internal(this,&type_prefix);
    ::std::__cxx11::string::~string((string *)&type_prefix);
  }
  bVar2 = Compiler::is_depth_image(&this->super_Compiler,imgtype,tex);
  if (((bVar2) && ((this->options).es == true)) && ((this->options).version < 300)) {
    bVar3 = ::std::operator==(op,"texture");
    if ((!bVar3) && (bVar3 = ::std::operator==(op,"textureProj"), !bVar3)) {
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      join<std::__cxx11::string_const&,char_const(&)[44]>
                (&type_prefix,(spirv_cross *)op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " not allowed on depth samplers in legacy ES",(char (*) [44])ts_1);
      CompilerError::CompilerError(pCVar7,&type_prefix);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::string
              ((string *)&type_prefix,"GL_EXT_shadow_samplers",(allocator *)&local_50);
    require_extension_internal(this,&type_prefix);
    ::std::__cxx11::string::~string((string *)&type_prefix);
  }
  bVar3 = ::std::operator==(op,"textureSize");
  if (bVar3) {
    if (((this->options).es == true) && ((this->options).version < 300)) {
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&type_prefix,"textureSize not supported in legacy ES",
                 (allocator *)&local_50);
      CompilerError::CompilerError(pCVar7,&type_prefix);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (bVar2) {
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&type_prefix,"textureSize not supported on shadow sampler in legacy GLSL"
                 ,(allocator *)&local_50);
      CompilerError::CompilerError(pCVar7,&type_prefix);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::string
              ((string *)&type_prefix,"GL_EXT_gpu_shader4",(allocator *)&local_50);
    require_extension_internal(this,&type_prefix);
    ::std::__cxx11::string::~string((string *)&type_prefix);
  }
  bVar4 = ::std::operator==(op,"texelFetch");
  bVar3 = (this->options).es;
  if (bVar4) {
    uVar5 = (this->options).version;
    bVar8 = uVar5 < 300 & bVar3;
    ts_1 = (uint *)CONCAT71((int7)((ulong)ts_1 >> 8),bVar8);
    if (bVar8 == 1) {
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&type_prefix,"texelFetch not supported in legacy ES",
                 (allocator *)&local_50);
      CompilerError::CompilerError(pCVar7,&type_prefix);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    uVar5 = (this->options).version;
  }
  pcVar10 = "texture";
  if (bVar2) {
    pcVar10 = "shadow";
  }
  ::std::__cxx11::string::string((string *)&type_prefix,pcVar10,(allocator *)&local_50);
  bVar8 = bVar2 & bVar3 & uVar5 < 300;
  bVar2 = ::std::operator==(op,"texture");
  psVar9 = local_78;
  if (bVar2) {
    if (bVar8 == 0) {
      join<std::__cxx11::string&,char_const*&>
                (local_78,(spirv_cross *)&type_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                 (char **)ts_1);
    }
    else {
      join<std::__cxx11::string&,char_const*&,char_const(&)[4]>
                (local_78,(spirv_cross *)&type_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                 (char **)0x37ce3f,(char (*) [4])CONCAT44(in_register_00000084,uVar11));
    }
  }
  else {
    bVar2 = ::std::operator==(op,"textureLod");
    psVar9 = local_78;
    if (bVar2) {
      local_50._M_dataplus._M_p = "Lod";
      if (bVar1) {
        local_50._M_dataplus._M_p = "LodEXT";
      }
      join<std::__cxx11::string&,char_const*&,char_const*>
                (local_78,(spirv_cross *)&type_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                 (char **)&local_50,(char **)CONCAT44(in_register_00000084,uVar11));
    }
    else {
      bVar2 = ::std::operator==(op,"textureProj");
      psVar9 = local_78;
      if (bVar2) {
        local_50._M_dataplus._M_p = "Proj";
        if (bVar8 != 0) {
          local_50._M_dataplus._M_p = "ProjEXT";
        }
        join<std::__cxx11::string&,char_const*&,char_const*>
                  (local_78,(spirv_cross *)&type_prefix,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                   (char **)&local_50,(char **)CONCAT44(in_register_00000084,uVar11));
      }
      else {
        bVar2 = ::std::operator==(op,"textureGrad");
        psVar9 = local_78;
        if (bVar2) {
          uVar5 = (this->options).version;
          pcVar10 = "GradARB";
          if (0x81 < uVar5) {
            pcVar10 = "Grad";
          }
          bVar1 = (this->options).es;
          if (bVar1 != false) {
            pcVar10 = "Grad";
          }
          local_50._M_dataplus._M_p = "GradEXT";
          if (299 < uVar5) {
            local_50._M_dataplus._M_p = pcVar10;
          }
          if (bVar1 == false) {
            local_50._M_dataplus._M_p = pcVar10;
          }
          join<std::__cxx11::string&,char_const*&,char_const*>
                    (local_78,(spirv_cross *)&type_prefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                     (char **)&local_50,(char **)CONCAT44(in_register_00000084,uVar11));
        }
        else {
          bVar2 = ::std::operator==(op,"textureProjLod");
          psVar9 = local_78;
          if (bVar2) {
            local_50._M_dataplus._M_p = "ProjLod";
            if (bVar1) {
              local_50._M_dataplus._M_p = "ProjLodEXT";
            }
            join<std::__cxx11::string&,char_const*&,char_const*>
                      (local_78,(spirv_cross *)&type_prefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                       (char **)&local_50,(char **)CONCAT44(in_register_00000084,uVar11));
          }
          else {
            bVar1 = ::std::operator==(op,"textureLodOffset");
            psVar9 = local_78;
            if (bVar1) {
              join<std::__cxx11::string&,char_const*&,char_const(&)[10]>
                        (local_78,(spirv_cross *)&type_prefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                         (char **)0x37997d,(char (*) [10])CONCAT44(in_register_00000084,uVar11));
            }
            else {
              bVar1 = ::std::operator==(op,"textureProjGrad");
              psVar9 = local_78;
              if (bVar1) {
                uVar5 = (this->options).version;
                pcVar10 = "ProjGradARB";
                if (0x81 < uVar5) {
                  pcVar10 = "ProjGrad";
                }
                bVar1 = (this->options).es;
                if (bVar1 != false) {
                  pcVar10 = "ProjGrad";
                }
                local_50._M_dataplus._M_p = "ProjGradEXT";
                if (299 < uVar5) {
                  local_50._M_dataplus._M_p = pcVar10;
                }
                if (bVar1 == false) {
                  local_50._M_dataplus._M_p = pcVar10;
                }
                join<std::__cxx11::string&,char_const*&,char_const*>
                          (local_78,(spirv_cross *)&type_prefix,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &type,(char **)&local_50,(char **)CONCAT44(in_register_00000084,uVar11));
              }
              else {
                bVar1 = ::std::operator==(op,"textureProjLodOffset");
                psVar9 = local_78;
                if (bVar1) {
                  join<std::__cxx11::string&,char_const*&,char_const(&)[14]>
                            (local_78,(spirv_cross *)&type_prefix,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &type,(char **)0x3799dd,
                             (char (*) [14])CONCAT44(in_register_00000084,uVar11));
                }
                else {
                  bVar1 = ::std::operator==(op,"textureSize");
                  psVar9 = local_78;
                  if (bVar1) {
                    join<char_const(&)[12],char_const*&>
                              (local_78,(spirv_cross *)"textureSize",(char (*) [12])&type,
                               (char **)ts_1);
                  }
                  else {
                    bVar1 = ::std::operator==(op,"texelFetch");
                    psVar9 = local_78;
                    if (!bVar1) {
                      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
                      join<char_const(&)[32],std::__cxx11::string_const&>
                                (&local_50,(spirv_cross *)"Unsupported legacy texture op: ",
                                 (char (*) [32])op,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)ts_1);
                      CompilerError::CompilerError(pCVar7,&local_50);
                      __cxa_throw(pCVar7,&CompilerError::typeinfo,
                                  ::std::runtime_error::~runtime_error);
                    }
                    join<char_const(&)[11],char_const*&>
                              (local_78,(spirv_cross *)"texelFetch",(char (*) [11])&type,
                               (char **)ts_1);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  ::std::__cxx11::string::~string((string *)&type_prefix);
  return psVar9;
}

Assistant:

string CompilerGLSL::legacy_tex_op(const std::string &op, const SPIRType &imgtype, uint32_t tex)
{
	const char *type;
	switch (imgtype.image.dim)
	{
	case spv::Dim1D:
		// Force 2D path for ES.
		if (options.es)
			type = (imgtype.image.arrayed && !options.es) ? "2DArray" : "2D";
		else
			type = (imgtype.image.arrayed && !options.es) ? "1DArray" : "1D";
		break;
	case spv::Dim2D:
		type = (imgtype.image.arrayed && !options.es) ? "2DArray" : "2D";
		break;
	case spv::Dim3D:
		type = "3D";
		break;
	case spv::DimCube:
		type = "Cube";
		break;
	case spv::DimRect:
		type = "2DRect";
		break;
	case spv::DimBuffer:
		type = "Buffer";
		break;
	case spv::DimSubpassData:
		type = "2D";
		break;
	default:
		type = "";
		break;
	}

	// In legacy GLSL, an extension is required for textureLod in the fragment
	// shader or textureGrad anywhere.
	bool legacy_lod_ext = false;
	auto &execution = get_entry_point();
	if (op == "textureGrad" || op == "textureProjGrad" ||
	    ((op == "textureLod" || op == "textureProjLod") && execution.model != ExecutionModelVertex))
	{
		if (is_legacy_es())
		{
			legacy_lod_ext = true;
			require_extension_internal("GL_EXT_shader_texture_lod");
		}
		else if (is_legacy_desktop())
			require_extension_internal("GL_ARB_shader_texture_lod");
	}

	if (op == "textureLodOffset" || op == "textureProjLodOffset")
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW(join(op, " not allowed in legacy ES"));

		require_extension_internal("GL_EXT_gpu_shader4");
	}

	// GLES has very limited support for shadow samplers.
	// Basically shadow2D and shadow2DProj work through EXT_shadow_samplers,
	// everything else can just throw
	bool is_comparison = is_depth_image(imgtype, tex);
	if (is_comparison && is_legacy_es())
	{
		if (op == "texture" || op == "textureProj")
			require_extension_internal("GL_EXT_shadow_samplers");
		else
			SPIRV_CROSS_THROW(join(op, " not allowed on depth samplers in legacy ES"));
	}

	if (op == "textureSize")
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW("textureSize not supported in legacy ES");
		if (is_comparison)
			SPIRV_CROSS_THROW("textureSize not supported on shadow sampler in legacy GLSL");
		require_extension_internal("GL_EXT_gpu_shader4");
	}

	if (op == "texelFetch" && is_legacy_es())
		SPIRV_CROSS_THROW("texelFetch not supported in legacy ES");

	bool is_es_and_depth = is_legacy_es() && is_comparison;
	std::string type_prefix = is_comparison ? "shadow" : "texture";

	if (op == "texture")
		return is_es_and_depth ? join(type_prefix, type, "EXT") : join(type_prefix, type);
	else if (op == "textureLod")
		return join(type_prefix, type, legacy_lod_ext ? "LodEXT" : "Lod");
	else if (op == "textureProj")
		return join(type_prefix, type, is_es_and_depth ? "ProjEXT" : "Proj");
	else if (op == "textureGrad")
		return join(type_prefix, type, is_legacy_es() ? "GradEXT" : is_legacy_desktop() ? "GradARB" : "Grad");
	else if (op == "textureProjLod")
		return join(type_prefix, type, legacy_lod_ext ? "ProjLodEXT" : "ProjLod");
	else if (op == "textureLodOffset")
		return join(type_prefix, type, "LodOffset");
	else if (op == "textureProjGrad")
		return join(type_prefix, type,
		            is_legacy_es() ? "ProjGradEXT" : is_legacy_desktop() ? "ProjGradARB" : "ProjGrad");
	else if (op == "textureProjLodOffset")
		return join(type_prefix, type, "ProjLodOffset");
	else if (op == "textureSize")
		return join("textureSize", type);
	else if (op == "texelFetch")
		return join("texelFetch", type);
	else
	{
		SPIRV_CROSS_THROW(join("Unsupported legacy texture op: ", op));
	}
}